

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::PhpName
                   (string *__return_storage_ptr__,string *full_name,bool is_descriptor)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int local_20;
  bool local_1b;
  int i;
  bool cap_next_letter;
  bool is_descriptor_local;
  string *full_name_local;
  string *result;
  
  if (is_descriptor) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&kDescriptorPackageName_abi_cxx11_);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_1b = true;
    for (local_20 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar2;
        local_20 = local_20 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
      if (((*pcVar3 < 'a') ||
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name), 'z' < *pcVar3)) ||
         (!local_1b)) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
        cVar1 = *pcVar3;
        if (cVar1 != '.') {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
        }
        local_1b = cVar1 == '.';
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)full_name);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3 + -0x20);
        local_1b = false;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpName(const std::string& full_name, bool is_descriptor) {
  if (is_descriptor) {
    return kDescriptorPackageName;
  }

  std::string result;
  bool cap_next_letter = true;
  for (int i = 0; i < full_name.size(); i++) {
    if ('a' <= full_name[i] && full_name[i] <= 'z' && cap_next_letter) {
      result += full_name[i] + ('A' - 'a');
      cap_next_letter = false;
    } else if (full_name[i] == '.') {
      result += '\\';
      cap_next_letter = true;
    } else {
      result += full_name[i];
      cap_next_letter = false;
    }
  }
  return result;
}